

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O1

void wallet::NotifyWalletLoaded(WalletContext *context,shared_ptr<wallet::CWallet> *wallet)

{
  _List_node_base *p_Var1;
  undefined8 uVar2;
  pointer *__ptr;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock11;
  long *local_48;
  unique_lock<std::mutex> local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_40._M_device = &(context->wallets_mutex).super_mutex;
  local_40._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_40);
  p_Var1 = (context->wallet_load_fns).
           super__List_base<std::function<void_(std::unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>)>,_std::allocator<std::function<void_(std::unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>)>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  do {
    if (p_Var1 == (_List_node_base *)&context->wallet_load_fns) {
      std::unique_lock<std::mutex>::~unique_lock(&local_40);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        return;
      }
LAB_00529fc0:
      __stack_chk_fail();
    }
    interfaces::MakeWallet((interfaces *)&local_48,context,(shared_ptr<wallet::CWallet> *)wallet);
    if (p_Var1[2]._M_next == (_List_node_base *)0x0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        uVar2 = std::__throw_bad_function_call();
        std::unique_lock<std::mutex>::~unique_lock(&local_40);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
          _Unwind_Resume(uVar2);
        }
      }
      goto LAB_00529fc0;
    }
    (*(code *)p_Var1[2]._M_prev)(p_Var1 + 1,&local_48);
    if (local_48 != (long *)0x0) {
      (**(code **)(*local_48 + 8))();
    }
    local_48 = (long *)0x0;
    p_Var1 = p_Var1->_M_next;
  } while( true );
}

Assistant:

void NotifyWalletLoaded(WalletContext& context, const std::shared_ptr<CWallet>& wallet)
{
    LOCK(context.wallets_mutex);
    for (auto& load_wallet : context.wallet_load_fns) {
        load_wallet(interfaces::MakeWallet(context, wallet));
    }
}